

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::setupViewport(QGraphicsView *this,QWidget *widget)

{
  GestureType *pGVar1;
  undefined1 uVar2;
  bool on;
  long lVar3;
  QList<Qt::GestureType> *__range2;
  long lVar4;
  long in_FS_OFFSET;
  QList<Qt::GestureType> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    setupViewport();
  }
  else {
    lVar4 = *(long *)(this + 8);
    lVar3 = (**(code **)(*(long *)widget + 8))(widget,"QOpenGLWidget");
    *(uint *)(lVar4 + 0x300) = *(uint *)(lVar4 + 0x300) & 0xffffffbf | (uint)(lVar3 == 0) << 6;
    QWidget::setFocusPolicy(widget,StrongFocus);
    if (lVar3 == 0) {
      QWidget::setAutoFillBackground(widget,true);
    }
    else {
      uVar2 = (**(code **)(**(long **)&widget->field_0x8 + 0x98))();
      *(undefined1 *)(lVar4 + 0x48c) = uVar2;
    }
    if (((((*(long *)(lVar4 + 0x490) != 0) && (*(int *)(*(long *)(lVar4 + 0x490) + 4) != 0)) &&
         (*(long *)(lVar4 + 0x498) != 0)) &&
        (((*(byte *)(*(long *)(*(long *)(lVar4 + 0x498) + 8) + 0xb9) & 0x10) == 0 ||
         ((*(byte *)(*(long *)(*(long *)(lVar4 + 0x498) + 8) + 0xb9) & 0x20) == 0)))) ||
       ((*(int *)(lVar4 + 0x47c) == 2 || (*(int *)(lVar4 + 0x480) == 2)))) {
      QWidget::setAttribute(widget,WA_MouseTracking,true);
    }
    if (((*(long *)(lVar4 + 0x490) != 0) && (*(int *)(*(long *)(lVar4 + 0x490) + 4) != 0)) &&
       ((*(long *)(lVar4 + 0x498) != 0 &&
        ((*(byte *)(*(long *)(*(long *)(lVar4 + 0x498) + 8) + 0xba) & 1) == 0)))) {
      QWidget::setAttribute(widget,WA_AcceptTouchEvents,true);
    }
    if (((*(long *)(lVar4 + 0x490) != 0) && (*(int *)(*(long *)(lVar4 + 0x490) + 4) != 0)) &&
       (*(long *)(lVar4 + 0x498) != 0)) {
      local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.ptr = (GestureType *)&DAT_aaaaaaaaaaaaaaaa;
      QHash<Qt::GestureType,_int>::keys
                (&local_48,
                 (QHash<Qt::GestureType,_int> *)(*(long *)(*(long *)(lVar4 + 0x498) + 8) + 0x368));
      pGVar1 = local_48.d.ptr;
      if ((undefined1 *)local_48.d.size != (undefined1 *)0x0) {
        lVar3 = local_48.d.size << 2;
        lVar4 = 0;
        do {
          QWidget::grabGesture(widget,*(GestureType *)((long)pGVar1 + lVar4),(GestureFlags)0x0);
          lVar4 = lVar4 + 4;
        } while (lVar3 != lVar4);
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
    on = QWidget::acceptDrops((QWidget *)this);
    QWidget::setAcceptDrops(widget,on);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::setupViewport(QWidget *widget)
{
    Q_D(QGraphicsView);

    if (!widget) {
        qWarning("QGraphicsView::setupViewport: cannot initialize null widget");
        return;
    }

    const bool isGLWidget = widget->inherits("QOpenGLWidget");

    d->accelerateScrolling = !(isGLWidget);

    widget->setFocusPolicy(Qt::StrongFocus);

    if (isGLWidget)
        d->stereoEnabled = QWidgetPrivate::get(widget)->isStereoEnabled();

    if (!isGLWidget) {
        // autoFillBackground enables scroll acceleration.
        widget->setAutoFillBackground(true);
    }

    // We are only interested in mouse tracking if items
    // accept hover events or use non-default cursors or if
    // AnchorUnderMouse is used as transformation or resize anchor.
    if ((d->scene && (!d->scene->d_func()->allItemsIgnoreHoverEvents
                     || !d->scene->d_func()->allItemsUseDefaultCursor))
        || d->transformationAnchor == AnchorUnderMouse
        || d->resizeAnchor == AnchorUnderMouse) {
        widget->setMouseTracking(true);
    }

    // enable touch events if any items is interested in them
    if (d->scene && !d->scene->d_func()->allItemsIgnoreTouchEvents)
        widget->setAttribute(Qt::WA_AcceptTouchEvents);

#ifndef QT_NO_GESTURES
    if (d->scene) {
        const auto gestures = d->scene->d_func()->grabbedGestures.keys();
        for (Qt::GestureType gesture : gestures)
            widget->grabGesture(gesture);
    }
#endif

    widget->setAcceptDrops(acceptDrops());
}